

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-custom-filter.cc
# Opt level: O1

bool __thiscall
StreamReplacer::maybeReplace
          (StreamReplacer *this,QPDFObjGen og,QPDFObjectHandle *stream,Pipeline *pipeline,
          QPDFObjectHandle *dict_updates)

{
  mapped_type mVar1;
  QPDFObjGen QVar2;
  undefined8 this_00;
  char cVar3;
  int __fd;
  unsigned_long i;
  ulong i_00;
  mapped_type *pmVar4;
  void *__buf;
  long *plVar5;
  Pipeline *__n;
  bool bVar6;
  Pl_XOR p;
  QPDFObjectHandle mark;
  QPDFObjectHandle dict;
  QPDFObjGen local_a0;
  undefined1 local_98 [16];
  undefined *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  mapped_type local_68;
  string local_60 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  undefined1 local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  __n = pipeline;
  local_a0 = og;
  QPDFObjectHandle::getDict();
  local_98._0_8_ = (element_type *)&local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"/DoXOR","");
  QPDFObjectHandle::getKey(local_60);
  if ((element_type *)local_98._0_8_ != (element_type *)&local_88) {
    operator_delete((void *)local_98._0_8_,(ulong)(local_88 + 1));
  }
  cVar3 = QPDFObjectHandle::isBool();
  if ((cVar3 == '\0') || (cVar3 = QPDFObjectHandle::getBoolValue(), cVar3 == '\0')) {
    bVar6 = false;
  }
  else {
    QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)local_98);
    this_00 = local_98._8_8_;
    local_98._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_98._0_8_ = (element_type *)0x0;
    if (dict_updates != (QPDFObjectHandle *)0x0) {
      local_98._0_8_ = (element_type *)&local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"/OrigLength","");
      i = Buffer::getSize();
      if ((long)i < 0) {
        QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::error(i);
      }
      QPDFObjectHandle::newInteger((longlong)local_50);
      QPDFObjectHandle::replaceKey((string *)dict_updates,(QPDFObjectHandle *)local_98);
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      }
      if ((element_type *)local_98._0_8_ != (element_type *)&local_88) {
        operator_delete((void *)local_98._0_8_,(ulong)(local_88 + 1));
      }
      QVar2 = local_a0;
      i_00 = Buffer::getSize();
      if (i_00 >> 0x1f != 0) {
        QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(i_00);
      }
      pmVar4 = std::
               map<QPDFObjGen,_unsigned_char,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_unsigned_char>_>_>
               ::operator[](&this->keys,&local_a0);
      *pmVar4 = (char)QVar2.obj * (char)i_00;
    }
    bVar6 = true;
    if (pipeline != (Pipeline *)0x0) {
      pmVar4 = std::
               map<QPDFObjGen,_unsigned_char,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_unsigned_char>_>_>
               ::operator[](&this->keys,&local_a0);
      mVar1 = *pmVar4;
      Pipeline::Pipeline((Pipeline *)local_98,"xor",pipeline);
      local_98._0_8_ = &PTR__Pipeline_00109ad8;
      local_68 = mVar1;
      __fd = Buffer::getBuffer();
      __buf = (void *)Buffer::getSize();
      Pl_XOR::write((Pl_XOR *)local_98,__fd,__buf,(size_t)__n);
      plVar5 = (long *)Pipeline::getNext(SUB81(local_98,0));
      (**(code **)(*plVar5 + 0x18))(plVar5);
      local_98._0_8_ = &PTR__Pipeline_00109bf0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._8_8_ != &local_80) {
        operator_delete((void *)local_98._8_8_,local_80._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)this_00 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    }
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  return bVar6;
}

Assistant:

bool
StreamReplacer::maybeReplace(
    QPDFObjGen og, QPDFObjectHandle& stream, Pipeline* pipeline, QPDFObjectHandle* dict_updates)
{
    // As described in the class comments, this method is called twice. Before writing has started
    // pipeline is nullptr, and dict_updates is provided. In this mode, we figure out whether we
    // should replace the stream and, if so, take care of the necessary setup. When we are actually
    // ready to supply the data, this method is called again with pipeline populated and
    // dict_updates as a nullptr. In this mode, we are not allowed to change anything, since writing
    // is already in progress. We must simply provide the stream data.

    // The return value indicates whether or not we should replace the stream. If the first call
    // returns false, there will be no second call. If the second call returns false, something went
    // wrong since the method should always make the same decision for a given stream.

    // For this example, all the determination logic could have appeared inside the if
    // (dict_updates) block rather than being duplicated, but in some cases, there may be a reason
    // to duplicate things. For example, if you wanted to write code that re-encoded an image if the
    // new encoding was more efficient, you'd have to actually try it out. Then you would either
    // have to cache the result somewhere or just repeat the calculations, depending on space/time
    // constraints, etc.

    // In our contrived example, we are replacing the data for all streams that have /DoXOR = true
    // in the stream dictionary. If this were a more realistic application, our criteria would be
    // more sensible. For example, an image downsampler might choose to replace a stream that
    // represented an image with a high pixel density.
    auto dict = stream.getDict();
    auto mark = dict.getKey("/DoXOR");
    if (!(mark.isBool() && mark.getBoolValue())) {
        return false;
    }

    // We can't replace the stream data if we can't get the original stream data for any reason. A
    // more realistic application may actually look at the data here as well, or it may be able to
    // make all its decisions from the stream dictionary. However, it's a good idea to make sure we
    // can retrieve the filtered data if we are going to need it later.
    std::shared_ptr<Buffer> out;
    try {
        out = stream.getStreamData();
    } catch (...) {
        return false;
    }

    if (dict_updates) {
        // It's not safe to make any modifications to any objects during the writing process since
        // the updated objects may have already been written. In this mode, when dict_updates is
        // provided, we have not started writing. Store the modifications we intend to make to the
        // stream dictionary here. We're just storing /OrigLength for purposes of example. Again, a
        // realistic application would make other changes. For example, an image resampler might
        // change the dimensions or other properties of the image.
        dict_updates->replaceKey(
            "/OrigLength", QPDFObjectHandle::newInteger(QIntC::to_longlong(out->getSize())));
        // We are also storing the "key" that we will access when writing the data.
        this->keys[og] = QIntC::to_uchar((og.getObj() * QIntC::to_int(out->getSize())) & 0xff);
    }

    if (pipeline) {
        unsigned char key = this->keys[og];
        Pl_XOR p("xor", pipeline, key);
        p.write(out->getBuffer(), out->getSize());
        p.finish();
    }
    return true;
}